

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteMultiCTopEmpty(CWriter *this)

{
  bool bVar1;
  size_t sVar2;
  string_view local_50;
  string_view local_40;
  reference local_30;
  Stream **stream;
  iterator __end2;
  iterator __begin2;
  vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_> *__range2;
  CWriter *this_local;
  
  __end2 = std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::begin(&this->c_streams_);
  stream = (Stream **)
           std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>::end(&this->c_streams_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Stream_**,_std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>_>
                                *)&stream);
    if (!bVar1) break;
    local_30 = __gnu_cxx::
               __normal_iterator<wabt::Stream_**,_std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>_>
               ::operator*(&__end2);
    sVar2 = Stream::offset(*local_30);
    if (sVar2 == 0) {
      this->stream_ = *local_30;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_40,"/* Empty wasm2c generated file */\n");
      Write(this,local_40);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_50,"typedef int dummy_def;");
      Write(this,local_50);
    }
    __gnu_cxx::
    __normal_iterator<wabt::Stream_**,_std::vector<wabt::Stream_*,_std::allocator<wabt::Stream_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void CWriter::WriteMultiCTopEmpty() {
  for (auto& stream : c_streams_) {
    if (stream->offset() == 0) {
      stream_ = stream;
      Write("/* Empty wasm2c generated file */\n");
      Write("typedef int dummy_def;");
    }
  }
}